

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrjpgcom.c
# Opt level: O0

void copy_variable(void)

{
  uint uVar1;
  uint length;
  int local_4;
  
  uVar1 = read_2_bytes();
  write_2_bytes(0);
  if (uVar1 < 2) {
    fprintf(_stderr,"%s\n","Erroneous JPEG marker length");
    exit(1);
  }
  for (local_4 = uVar1 - 2; local_4 != 0; local_4 = local_4 + -1) {
    read_1_byte();
    write_1_byte(0);
  }
  return;
}

Assistant:

static void
copy_variable(void)
/* Copy an unknown or uninteresting variable-length marker */
{
  unsigned int length;

  /* Get the marker parameter length count */
  length = read_2_bytes();
  write_2_bytes(length);
  /* Length includes itself, so must be at least 2 */
  if (length < 2)
    ERREXIT("Erroneous JPEG marker length");
  length -= 2;
  /* Copy the remaining bytes */
  while (length > 0) {
    write_1_byte(read_1_byte());
    length--;
  }
}